

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::mark_aligned_access
          (PhysicalStorageBufferPointerHandler *this,uint32_t id,uint32_t *args,uint32_t length)

{
  uint uVar1;
  uint *puVar2;
  const_iterator cVar3;
  uint32_t local_c;
  
  if (length != 1) {
    uVar1 = *args;
    if (((uVar1 & 2) != 0) && ((length == 2 & (byte)uVar1) == 0)) {
      uVar1 = args[(ulong)(uVar1 & 1) + 1];
      local_c = id;
      cVar3 = ::std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->access_chain_to_physical_block)._M_h,&local_c);
      if ((cVar3.
           super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>,_false>
           ._M_cur != (__node_type *)0x0) &&
         ((puVar2 = *(uint **)((long)cVar3.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>,_false>
                                     ._M_cur + 0x10), puVar2 != (uint *)0x0 && (*puVar2 < uVar1))))
      {
        *puVar2 = uVar1;
      }
    }
  }
  return;
}

Assistant:

void Compiler::PhysicalStorageBufferPointerHandler::mark_aligned_access(uint32_t id, const uint32_t *args, uint32_t length)
{
	uint32_t mask = *args;
	args++;
	length--;
	if (length && (mask & MemoryAccessVolatileMask) != 0)
	{
		args++;
		length--;
	}

	if (length && (mask & MemoryAccessAlignedMask) != 0)
	{
		uint32_t alignment = *args;
		auto *meta = find_block_meta(id);

		// This makes the assumption that the application does not rely on insane edge cases like:
		// Bind buffer with ADDR = 8, use block offset of 8 bytes, load/store with 16 byte alignment.
		// If we emit the buffer with alignment = 16 here, the first element at offset = 0 should
		// actually have alignment of 8 bytes, but this is too theoretical and awkward to support.
		// We could potentially keep track of any offset in the access chain, but it's
		// practically impossible for high level compilers to emit code like that,
		// so deducing overall alignment requirement based on maximum observed Alignment value is probably fine.
		if (meta && alignment > meta->alignment)
			meta->alignment = alignment;
	}
}